

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pure.cpp
# Opt level: O2

string * fs_root_name_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  path local_70;
  path local_48;
  string_view path_local;
  
  path_local._M_str = path._M_str;
  path_local._M_len = path._M_len;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_48,&path_local,auto_format);
  std::filesystem::__cxx11::path::root_name();
  std::filesystem::__cxx11::path::string(__return_storage_ptr__,&local_70);
  std::filesystem::__cxx11::path::~path(&local_70);
  std::filesystem::__cxx11::path::~path(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_root_name(FFS_MAYBE_UNUSED std::string_view path)
{

#ifdef HAVE_CXX_FILESYSTEM
  return std::filesystem::path(path).root_name().string();
#elif defined(_WIN32)
  char drive[_MAX_DRIVE];
// https://learn.microsoft.com/en-us/cpp/c-runtime-library/reference/splitpath-s-wsplitpath-s
  if(_splitpath_s(path.data(), drive, _MAX_DRIVE, nullptr, 0, nullptr, 0, nullptr, 0) == 0)
    return fs_trim(drive);
#endif
  return {};
}